

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  int i_1;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int q;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint _w;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  float fVar16;
  int local_e0;
  int local_d0;
  Mat sums;
  Mat local_78;
  
  sVar2 = a->elemsize;
  iVar9 = a->dims;
  if (iVar9 == 3) {
    uVar8 = a->w;
    lVar10 = (long)(int)uVar8;
    uVar14 = a->h;
    _w = a->c;
    uVar13 = uVar14 * uVar8;
    bVar4 = !reduce_h;
    if ((reduce_w && !bVar4) && reduce_c) {
      Mat::create(b,1,1,1,sVar2,opt->blob_allocator);
      Mat::Mat(&sums,_w,sVar2,opt->workspace_allocator);
      local_e0 = -100;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        uVar6 = 0;
        uVar15 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar15 = uVar6;
        }
        uVar11 = (ulong)_w;
        if ((int)_w < 1) {
          uVar11 = uVar6;
        }
        for (; uVar6 != uVar11; uVar6 = uVar6 + 1) {
          Mat::channel(&local_78,a,(int)uVar6);
          pvVar5 = local_78.data;
          Mat::~Mat(&local_78);
          fVar16 = 0.0;
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            fVar1 = *(float *)((long)pvVar5 + uVar12 * 4);
            fVar16 = fVar16 + fVar1 * fVar1;
          }
          *(float *)((long)sums.data + uVar6 * 4) = fVar16;
        }
        fVar16 = 0.0;
        for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
          fVar16 = fVar16 + *(float *)((long)sums.data + uVar15 * 4);
        }
        *(float *)b->data = fVar16;
        local_e0 = 0;
      }
    }
    else {
      if ((reduce_w && !bVar4) && !reduce_c) {
        Mat::create(b,1,1,_w,sVar2,opt->blob_allocator);
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        if ((int)_w < 1) {
          _w = 0;
        }
        for (uVar8 = 0; uVar8 != _w; uVar8 = uVar8 + 1) {
          Mat::channel(&sums,a,uVar8);
          pvVar5 = sums.data;
          Mat::~Mat(&sums);
          Mat::channel(&sums,b,uVar8);
          pvVar3 = sums.data;
          Mat::~Mat(&sums);
          fVar16 = 0.0;
          for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
            fVar1 = *(float *)((long)pvVar5 + uVar15 * 4);
            fVar16 = fVar16 + fVar1 * fVar1;
          }
          *(float *)pvVar3 = fVar16;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar14,_w,sVar2,opt->blob_allocator);
        uVar15 = 0;
        if (0 < (int)uVar8) {
          uVar15 = (ulong)uVar8;
        }
        uVar6 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar6 = 0;
        }
        uVar11 = (ulong)_w;
        if ((int)_w < 1) {
          uVar11 = 0;
        }
        for (iVar9 = 0; local_d0 = (int)uVar11, iVar9 != local_d0; iVar9 = iVar9 + 1) {
          Mat::channel(&sums,a,iVar9);
          pvVar5 = sums.data;
          Mat::~Mat(&sums);
          Mat::channel(&sums,b,iVar9);
          pvVar3 = sums.data;
          Mat::~Mat(&sums);
          for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
            fVar16 = 0.0;
            for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
              fVar1 = *(float *)((long)pvVar5 + uVar7 * 4);
              fVar16 = fVar16 + fVar1 * fVar1;
            }
            *(float *)((long)pvVar3 + uVar12 * 4) = fVar16;
            pvVar5 = (void *)((long)pvVar5 + lVar10 * 4);
          }
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar14,1,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar14,_w,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar13 = 0;
          uVar15 = 0;
          if (0 < (int)uVar8) {
            uVar15 = (ulong)uVar8;
          }
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar13 != _w; uVar13 = uVar13 + 1) {
            Mat::channel(&local_78,a,uVar13);
            pvVar5 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,uVar13);
            pvVar3 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar6 = 0; uVar6 != uVar14; uVar6 = uVar6 + 1) {
              fVar16 = 0.0;
              for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
                fVar1 = *(float *)((long)pvVar5 + uVar11 * 4);
                fVar16 = fVar16 + fVar1 * fVar1;
              }
              *(float *)((long)pvVar3 + uVar6 * 4) = fVar16;
              pvVar5 = (void *)((long)pvVar5 + lVar10 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_e0 = 0;
          for (uVar8 = 0; uVar8 != _w; uVar8 = uVar8 + 1) {
            Mat::channel(&local_78,&sums,uVar8);
            pvVar3 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar5 = b->data;
            for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
              *(float *)((long)pvVar5 + uVar15 * 4) =
                   *(float *)((long)pvVar3 + uVar15 * 4) + *(float *)((long)pvVar5 + uVar15 * 4);
            }
          }
        }
      }
      else {
        if ((bVar4 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar8,uVar14,1,sVar2,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar15 = (ulong)uVar13;
            if ((int)uVar13 < 1) {
              uVar15 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar8 = 0; uVar8 != _w; uVar8 = uVar8 + 1) {
              Mat::channel(&sums,a,uVar8);
              pvVar3 = sums.data;
              Mat::~Mat(&sums);
              pvVar5 = b->data;
              for (uVar6 = 0; uVar15 != uVar6; uVar6 = uVar6 + 1) {
                fVar16 = *(float *)((long)pvVar3 + uVar6 * 4);
                *(float *)((long)pvVar5 + uVar6 * 4) =
                     fVar16 * fVar16 + *(float *)((long)pvVar5 + uVar6 * 4);
              }
            }
            return 0;
          }
          if ((bVar4 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar8,1,_w,sVar2,opt->blob_allocator);
          Mat::fill(b,0.0);
          uVar15 = 0;
          if (0 < (int)uVar8) {
            uVar15 = (ulong)uVar8;
          }
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (uVar8 = 0; uVar8 != _w; uVar8 = uVar8 + 1) {
            Mat::channel(&sums,a,uVar8);
            pvVar5 = sums.data;
            Mat::~Mat(&sums);
            Mat::channel(&sums,b,uVar8);
            pvVar3 = sums.data;
            Mat::~Mat(&sums);
            for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
              for (uVar6 = 0; uVar15 != uVar6; uVar6 = uVar6 + 1) {
                fVar16 = *(float *)((long)pvVar5 + uVar6 * 4);
                *(float *)((long)pvVar3 + uVar6 * 4) =
                     fVar16 * fVar16 + *(float *)((long)pvVar3 + uVar6 * 4);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar10 * 4);
            }
          }
          return 0;
        }
        Mat::create(b,uVar8,1,1,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,uVar8,1,_w,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar13 = 0;
          uVar15 = 0;
          if (0 < (int)uVar8) {
            uVar15 = (ulong)uVar8;
          }
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar13 != _w; uVar13 = uVar13 + 1) {
            Mat::channel(&local_78,a,uVar13);
            pvVar5 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,uVar13);
            pvVar3 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar8 = 0; uVar8 != uVar14; uVar8 = uVar8 + 1) {
              for (uVar6 = 0; uVar15 != uVar6; uVar6 = uVar6 + 1) {
                fVar16 = *(float *)((long)pvVar5 + uVar6 * 4);
                *(float *)((long)pvVar3 + uVar6 * 4) =
                     fVar16 * fVar16 + *(float *)((long)pvVar3 + uVar6 * 4);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar10 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_e0 = 0;
          for (uVar8 = 0; uVar8 != _w; uVar8 = uVar8 + 1) {
            Mat::channel(&local_78,&sums,uVar8);
            pvVar3 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar5 = b->data;
            for (uVar6 = 0; uVar15 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar5 + uVar6 * 4) =
                   *(float *)((long)pvVar3 + uVar6 * 4) + *(float *)((long)pvVar5 + uVar6 * 4);
            }
          }
        }
      }
    }
LAB_001db6a8:
    Mat::~Mat(&sums);
  }
  else {
    if (iVar9 == 2) {
      uVar8 = a->w;
      uVar14 = a->h;
      if (reduce_w && reduce_h) {
        Mat::create(b,1,1,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,uVar14,sVar2,opt->workspace_allocator);
        local_e0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          iVar9 = a->w;
          sVar2 = a->elemsize;
          uVar6 = 0;
          uVar15 = (ulong)uVar8;
          if ((int)uVar8 < 1) {
            uVar15 = uVar6;
          }
          pvVar5 = a->data;
          uVar11 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar11 = uVar6;
          }
          for (; fVar16 = 0.0, uVar6 != uVar11; uVar6 = uVar6 + 1) {
            for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
              fVar1 = *(float *)((long)pvVar5 + uVar12 * 4);
              fVar16 = fVar16 + fVar1 * fVar1;
            }
            *(float *)((long)sums.data + uVar6 * 4) = fVar16;
            pvVar5 = (void *)((long)pvVar5 + (long)iVar9 * sVar2);
          }
          for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
            fVar16 = fVar16 + *(float *)((long)sums.data + uVar15 * 4);
          }
          *(float *)b->data = fVar16;
          local_e0 = 0;
        }
        goto LAB_001db6a8;
      }
      if (reduce_w && !reduce_h) {
        Mat::create(b,1,uVar14,sVar2,opt->blob_allocator);
        pvVar5 = a->data;
        iVar9 = a->w;
        sVar2 = a->elemsize;
        pvVar3 = b->data;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        uVar15 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar15 = 0;
        }
        for (uVar6 = 0; uVar6 != uVar15; uVar6 = uVar6 + 1) {
          fVar16 = 0.0;
          for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
            fVar1 = *(float *)((long)pvVar5 + uVar11 * 4);
            fVar16 = fVar16 + fVar1 * fVar1;
          }
          *(float *)((long)pvVar3 + uVar6 * 4) = fVar16;
          pvVar5 = (void *)((long)pvVar5 + (long)iVar9 * sVar2);
        }
      }
      else {
        if (!reduce_h || reduce_w) {
          return 0;
        }
        Mat::create(b,uVar8,1,sVar2,opt->blob_allocator);
        Mat::fill(b,0.0);
        pvVar5 = a->data;
        iVar9 = a->w;
        sVar2 = a->elemsize;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        uVar15 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar15 = 0;
        }
        for (uVar6 = 0; uVar6 != uVar15; uVar6 = uVar6 + 1) {
          pvVar3 = b->data;
          for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
            fVar16 = *(float *)((long)pvVar5 + uVar11 * 4);
            *(float *)((long)pvVar3 + uVar11 * 4) =
                 fVar16 * fVar16 + *(float *)((long)pvVar3 + uVar11 * 4);
          }
          pvVar5 = (void *)((long)pvVar5 + (long)iVar9 * sVar2);
        }
      }
    }
    else {
      if (iVar9 != 1) {
        return 0;
      }
      uVar8 = a->w;
      Mat::create(b,1,sVar2,opt->blob_allocator);
      uVar6 = 0;
      uVar15 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar15 = uVar6;
      }
      fVar16 = 0.0;
      for (; uVar15 != uVar6; uVar6 = uVar6 + 1) {
        fVar1 = *(float *)((long)a->data + uVar6 * 4);
        fVar16 = fVar16 + fVar1 * fVar1;
      }
      *(float *)b->data = fVar16;
    }
    local_e0 = 0;
  }
  return local_e0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}